

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_wait_ms(int timeout_ms)

{
  int *piVar1;
  timediff_t tVar2;
  curltime cVar3;
  curltime cVar4;
  curltime newer;
  int error;
  int local_28;
  int local_24;
  int r;
  int pending_ms;
  curltime initial_tv;
  int timeout_ms_local;
  
  if (timeout_ms == 0) {
    initial_tv._12_4_ = 0;
  }
  else if (timeout_ms < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    initial_tv._12_4_ = 0xffffffff;
  }
  else {
    cVar3 = Curl_now();
    local_24 = timeout_ms;
    do {
      local_28 = poll((pollfd *)0x0,0,local_24);
      if (local_28 != -1) goto LAB_00748069;
      piVar1 = __errno_location();
      if ((*piVar1 != 0) && ((Curl_ack_eintr != 0 || (*piVar1 != 4)))) goto LAB_00748069;
      cVar4 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar4._0_12_,0);
      newer.tv_usec = SUB124(cVar4._0_12_,8);
      cVar4._12_4_ = 0;
      cVar4.tv_sec = SUB128(cVar3._0_12_,0);
      cVar4.tv_usec = SUB124(cVar3._0_12_,8);
      tVar2 = Curl_timediff(newer,cVar4);
      local_24 = timeout_ms - (int)tVar2;
    } while (0 < local_24);
    local_28 = 0;
LAB_00748069:
    if (local_28 != 0) {
      local_28 = -1;
    }
    initial_tv._12_4_ = local_28;
  }
  return initial_tv._12_4_;
}

Assistant:

int Curl_wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct curltime initial_tv;
  int pending_ms;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = Curl_now();
  do {
    int error;
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    pending_ms = timeout_ms - ELAPSED_MS();
    if(pending_ms <= 0) {
      r = 0;  /* Simulate a "call timed out" case */
      break;
    }
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}